

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

Variable * __thiscall soul::ModuleCloner::getRemappedVariable(ModuleCloner *this,Variable *old)

{
  unordered_map<soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
  *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  Variable *local_68;
  pool_ref<const_soul::heart::Variable> local_28;
  pool_ptr<soul::heart::Variable> local_20;
  mapped_type v;
  Variable *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->variableMappings;
  v.object = old;
  pool_ref<soul::heart::Variable_const>::pool_ref<soul::heart::Variable,void>
            ((pool_ref<soul::heart::Variable_const> *)&local_28,old);
  pmVar2 = std::
           unordered_map<soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
           ::operator[](this_00,(key_type *)&local_28);
  local_20.object = pmVar2->object;
  pool_ref<const_soul::heart::Variable>::~pool_ref(&local_28);
  bVar1 = pool_ptr<soul::heart::Variable>::operator==(&local_20,(void *)0x0);
  if (bVar1) {
    local_68 = cloneVariable(this,v.object);
  }
  else {
    local_68 = pool_ptr<soul::heart::Variable>::operator*(&local_20);
  }
  pool_ptr<soul::heart::Variable>::~pool_ptr(&local_20);
  return local_68;
}

Assistant:

heart::Variable& getRemappedVariable (heart::Variable& old)
    {
        auto v = variableMappings[old];
        return v == nullptr ? cloneVariable (old) : *v;
    }